

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTBuilder.cpp
# Opt level: O2

void __thiscall AST::ASTBuilder::removeSelfIfOnlyHasOneChild(ASTBuilder *this)

{
  ASTNode *this_00;
  _Elt_pointer ppAVar1;
  deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_> *pdVar2;
  size_type sVar3;
  reference ppAVar4;
  value_type B;
  ASTNode *local_18;
  
  ppAVar1 = (this->stack).c.super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppAVar1 ==
      (this->stack).c.super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppAVar1 = (this->stack).c.super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  this_00 = ppAVar1[-1];
  local_18 = this_00;
  std::deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>::pop_back(&(this->stack).c);
  pdVar2 = ASTNode::getChildren(this_00);
  sVar3 = std::deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>::size(pdVar2);
  if (sVar3 == 1) {
    pdVar2 = ASTNode::getChildren(this_00);
    ppAVar4 = std::deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>::at(pdVar2,0);
    local_18 = *ppAVar4;
  }
  std::deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>::push_back(&(this->stack).c,&local_18)
  ;
  return;
}

Assistant:

void AST::ASTBuilder::removeSelfIfOnlyHasOneChild() {
    auto B = stack.top();
    stack.pop();
    if (B->getChildren().size() == 1) B = B->getChildren().at(0);
    stack.push(B);
}